

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter_impl.h
# Opt level: O0

void __thiscall
spdlog::details::aggregate_formatter::~aggregate_formatter(aggregate_formatter *this)

{
  aggregate_formatter *this_local;
  
  ~aggregate_formatter(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

class aggregate_formatter SPDLOG_FINAL : public flag_formatter
{
public:
    aggregate_formatter() = default;

    void add_ch(char ch)
    {
        _str += ch;
    }
    void format(details::log_msg &msg, const std::tm &) override
    {
        msg.formatted << _str;
    }

private:
    std::string _str;
}